

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

void google::protobuf::ServiceOptions::SharedDtor(MessageLite *self)

{
  FeatureSet *this;
  ulong uVar1;
  LogMessageFatal local_20;
  
  internal::InternalMetadata::Delete<google::protobuf::UnknownFieldSet>(&self->_internal_metadata_);
  uVar1 = (self->_internal_metadata_).ptr_;
  if ((uVar1 & 1) != 0) {
    uVar1 = *(ulong *)(uVar1 & 0xfffffffffffffffe);
  }
  if (uVar1 == 0) {
    this = (FeatureSet *)self[4]._internal_metadata_.ptr_;
    if (this != (FeatureSet *)0x0) {
      FeatureSet::~FeatureSet(this);
    }
    operator_delete(this,0x50);
    Impl_::~Impl_((Impl_ *)(self + 1));
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&local_20,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.pb.cc"
             ,0x2de2,"this_.GetArena() == nullptr");
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_20);
}

Assistant:

inline void ServiceOptions::SharedDtor(MessageLite& self) {
  ServiceOptions& this_ = static_cast<ServiceOptions&>(self);
  this_._internal_metadata_.Delete<::google::protobuf::UnknownFieldSet>();
  ABSL_DCHECK(this_.GetArena() == nullptr);
  delete this_._impl_.features_;
  this_._impl_.~Impl_();
}